

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall server_response::remove_waiting_task_id(server_response *this,int id_task)

{
  common_log *log;
  __normal_iterator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_*,_std::vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>_>
  __first;
  unique_lock<std::mutex> lock;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ggerganov[P]llama_examples_server_server_cpp:1745:72)>
  local_2c;
  unique_lock<std::mutex> local_28;
  
  local_2c._M_pred.id_task =
       (anon_class_4_1_e5de0d09_for__M_pred)(anon_class_4_1_e5de0d09_for__M_pred)id_task;
  if (0 < common_log_verbosity_thold) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_DEBUG,
                   "srv  %12.*s: remove task %d from waiting list. current waiting = %d (before remove)\n"
                   ,0xc,"remove_waiting_task_id",(ulong)(uint)id_task,
                   (int)(this->waiting_task_ids)._M_h._M_element_count);
  }
  local_28._M_device = &this->mutex_results;
  local_28._M_owns = false;
  httplib::detail::std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  httplib::detail::std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->waiting_task_ids)._M_h,&local_2c);
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>*,std::vector<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>,std::allocator<std::unique_ptr<server_task_result,std::default_delete<server_task_result>>>>>,__gnu_cxx::__ops::_Iter_pred<server_response::remove_waiting_task_id(int)::_lambda(std::unique_ptr<server_task_result,std::default_delete<server_task_result>>const&)_1_>>
                      ((this->queue_results).
                       super__Vector_base<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->queue_results).
                       super__Vector_base<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,local_2c);
  httplib::detail::std::
  vector<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
  ::_M_erase(&this->queue_results,(iterator)__first._M_current,
             (this->queue_results).
             super__Vector_base<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>,_std::allocator<std::unique_ptr<server_task_result,_std::default_delete<server_task_result>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  httplib::detail::std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void remove_waiting_task_id(int id_task) {
        SRV_DBG("remove task %d from waiting list. current waiting = %d (before remove)\n", id_task, (int) waiting_task_ids.size());

        std::unique_lock<std::mutex> lock(mutex_results);
        waiting_task_ids.erase(id_task);
        // make sure to clean up all pending results
        queue_results.erase(
            std::remove_if(queue_results.begin(), queue_results.end(), [id_task](const server_task_result_ptr & res) {
                return res->id == id_task;
            }),
            queue_results.end());
    }